

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_q5_1_ref(float *x,block_q5_1 *y,int64_t k)

{
  float *pfVar1;
  float *pfVar2;
  char cVar3;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [11];
  undefined1 auVar38 [13];
  undefined1 auVar39 [14];
  undefined1 auVar40 [15];
  undefined1 auVar41 [11];
  undefined1 auVar42 [14];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  uint6 uVar47;
  uint6 uVar48;
  undefined1 auVar49 [16];
  uint uVar50;
  uint8_t *puVar51;
  ulong uVar52;
  int j;
  long lVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar57;
  ushort uVar58;
  undefined1 auVar70 [15];
  uint uVar59;
  float fVar60;
  uint uVar75;
  float fVar76;
  int iVar78;
  undefined1 auVar71 [16];
  int iVar61;
  int iVar77;
  int iVar79;
  undefined1 auVar74 [16];
  int iVar80;
  int iVar82;
  int iVar83;
  undefined1 auVar81 [16];
  int iVar84;
  ushort uVar85;
  undefined1 auVar92 [15];
  undefined6 uVar86;
  undefined1 auVar95 [16];
  uint32_t w;
  float fVar96;
  float fVar97;
  uint uVar98;
  uint uVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined4 uVar62;
  uint uVar63;
  undefined6 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar68 [14];
  undefined1 auVar69 [14];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined8 uVar87;
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [14];
  undefined1 auVar91 [14];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  
  auVar49 = _DAT_0014e6c0;
  lVar53 = k + 0x1f;
  if (-1 < k) {
    lVar53 = k;
  }
  uVar50 = (uint)(lVar53 >> 5);
  if (0 < (int)uVar50) {
    puVar51 = y->qs;
    uVar52 = 0;
    do {
      lVar53 = 0;
      fVar60 = -3.4028235e+38;
      fVar76 = 3.4028235e+38;
      do {
        fVar96 = x[lVar53];
        fVar97 = fVar96;
        if (fVar76 <= fVar96) {
          fVar97 = fVar76;
        }
        if (fVar96 <= fVar60) {
          fVar96 = fVar60;
        }
        lVar53 = lVar53 + 1;
        fVar60 = fVar96;
        fVar76 = fVar97;
      } while (lVar53 != 0x20);
      fVar96 = (fVar96 - fVar97) / 31.0;
      uVar98 = (int)fVar96 * 2 ^ 0x80000000;
      uVar99 = (int)fVar97 * 2 ^ 0x80000000;
      uVar59 = -(uint)(-0xf000001 < (int)uVar98);
      uVar75 = -(uint)(-0xf000001 < (int)uVar99);
      fVar60 = (float)(~uVar59 & 0x40000000 | ((uint)fVar96 & 0x7f800000) + 0x7800000 & uVar59) +
               ABS(fVar96) * 5.192297e+33 * 7.70372e-34;
      fVar76 = (float)(~uVar75 & 0x40000000 | ((uint)fVar97 & 0x7f800000) + 0x7800000 & uVar75) +
               ABS(fVar97) * 5.192297e+33 * 7.70372e-34;
      auVar71._0_4_ = ((uint)fVar60 & 0xfff) + ((uint)fVar60 >> 0xd & 0x7c00);
      auVar71._4_4_ = ((uint)fVar76 & 0xfff) + ((uint)fVar76 >> 0xd & 0x7c00);
      auVar71._8_8_ = 0;
      auVar81._0_4_ = -(uint)(0x7f000000 < (int)uVar98);
      auVar81._4_4_ = -(uint)(0x7f000000 < (int)uVar99);
      auVar81._8_8_ = 0;
      auVar54._0_4_ = (uint)fVar96 >> 0x10;
      auVar54._4_4_ = (uint)fVar97 >> 0x10;
      auVar54._8_8_ = 0;
      auVar54 = pshuflw(auVar54 & _DAT_0014e670,
                        auVar81 & _DAT_0014e690 | auVar54 & _DAT_0014e670 | ~auVar81 & auVar71,0xe8)
      ;
      y[uVar52].field_0.dm = auVar54._0_4_;
      fVar60 = (float)(-(uint)(fVar96 != 0.0) & (uint)(1.0 / fVar96));
      uVar59 = 0;
      uVar75 = 0;
      uVar98 = 0;
      uVar99 = 0;
      lVar53 = 0;
      iVar80 = 0;
      iVar82 = 1;
      iVar83 = 2;
      iVar84 = 3;
      iVar100 = iVar80;
      iVar101 = iVar82;
      iVar102 = iVar83;
      iVar103 = iVar84;
      do {
        pfVar1 = x + lVar53;
        pfVar2 = x + lVar53 + 0x10;
        iVar61 = (int)((*pfVar1 - fVar97) * fVar60 + 0.5);
        iVar77 = (int)((pfVar1[1] - fVar97) * fVar60 + 0.5);
        iVar78 = (int)((pfVar1[2] - fVar97) * fVar60 + 0.5);
        iVar79 = (int)((pfVar1[3] - fVar97) * fVar60 + 0.5);
        sVar8 = (short)iVar61;
        cVar3 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar61 - (0xff < sVar8);
        sVar9 = (short)((uint)iVar61 >> 0x10);
        cVar16 = (char)((uint)iVar61 >> 0x10);
        sVar57 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar16 - (0xff < sVar9),cVar3);
        sVar10 = (short)iVar77;
        cVar4 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar77 - (0xff < sVar10);
        sVar11 = (short)((uint)iVar77 >> 0x10);
        cVar17 = (char)((uint)iVar77 >> 0x10);
        uVar62 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar17 - (0xff < sVar11),
                          CONCAT12(cVar4,sVar57));
        sVar12 = (short)iVar78;
        cVar5 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar78 - (0xff < sVar12);
        sVar13 = (short)((uint)iVar78 >> 0x10);
        cVar18 = (char)((uint)iVar78 >> 0x10);
        uVar64 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar18 - (0xff < sVar13),
                          CONCAT14(cVar5,uVar62));
        sVar14 = (short)iVar79;
        cVar6 = (0 < sVar14) * (sVar14 < 0x100) * (char)iVar79 - (0xff < sVar14);
        sVar15 = (short)((uint)iVar79 >> 0x10);
        cVar19 = (char)((uint)iVar79 >> 0x10);
        uVar65 = CONCAT17((0 < sVar15) * (sVar15 < 0x100) * cVar19 - (0xff < sVar15),
                          CONCAT16(cVar6,uVar64));
        cVar7 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar61 - (0xff < sVar8);
        auVar66._0_10_ =
             CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar16 - (0xff < sVar9),CONCAT18(cVar7,uVar65)
                     );
        cVar16 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar77 - (0xff < sVar10);
        auVar66[10] = cVar16;
        auVar66[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar17 - (0xff < sVar11);
        cVar17 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar78 - (0xff < sVar12);
        auVar68[0xc] = cVar17;
        auVar68._0_12_ = auVar66;
        auVar68[0xd] = (0 < sVar13) * (sVar13 < 0x100) * cVar18 - (0xff < sVar13);
        cVar18 = (0 < sVar14) * (sVar14 < 0x100) * (char)iVar79 - (0xff < sVar14);
        auVar72[0xe] = cVar18;
        auVar72._0_14_ = auVar68;
        auVar72[0xf] = (0 < sVar15) * (sVar15 < 0x100) * cVar19 - (0xff < sVar15);
        sVar8 = (short)((uint)uVar62 >> 0x10);
        uVar58 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar4 - (0xff < sVar8),
                          (0 < sVar57) * (sVar57 < 0x100) * cVar3 - (0xff < sVar57));
        sVar9 = (short)((uint6)uVar64 >> 0x20);
        sVar10 = (short)((ulong)uVar65 >> 0x30);
        uVar63 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10),
                          CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9),uVar58));
        sVar11 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
        sVar12 = auVar66._10_2_;
        uVar64 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar16 - (0xff < sVar12),
                          CONCAT14((0 < sVar11) * (sVar11 < 0x100) * cVar7 - (0xff < sVar11),uVar63)
                         );
        sVar13 = auVar68._12_2_;
        sVar14 = auVar72._14_2_;
        uVar65 = CONCAT17((0 < sVar14) * (sVar14 < 0x100) * cVar18 - (0xff < sVar14),
                          CONCAT16((0 < sVar13) * (sVar13 < 0x100) * cVar17 - (0xff < sVar13),uVar64
                                  ));
        auVar67._0_10_ =
             CONCAT19((0 < sVar8) * (sVar8 < 0x100) * cVar4 - (0xff < sVar8),
                      CONCAT18((0 < sVar57) * (sVar57 < 0x100) * cVar3 - (0xff < sVar57),uVar65));
        auVar67[10] = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
        auVar67[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
        auVar69[0xc] = (0 < sVar11) * (sVar11 < 0x100) * cVar7 - (0xff < sVar11);
        auVar69._0_12_ = auVar67;
        auVar69[0xd] = (0 < sVar12) * (sVar12 < 0x100) * cVar16 - (0xff < sVar12);
        auVar73[0xe] = (0 < sVar13) * (sVar13 < 0x100) * cVar17 - (0xff < sVar13);
        auVar73._0_14_ = auVar69;
        auVar73[0xf] = (0 < sVar14) * (sVar14 < 0x100) * cVar18 - (0xff < sVar14);
        iVar61 = (int)((*pfVar2 - fVar97) * fVar60 + 0.5);
        iVar77 = (int)((pfVar2[1] - fVar97) * fVar60 + 0.5);
        iVar78 = (int)((pfVar2[2] - fVar97) * fVar60 + 0.5);
        iVar79 = (int)((pfVar2[3] - fVar97) * fVar60 + 0.5);
        sVar8 = (short)iVar61;
        cVar3 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar61 - (0xff < sVar8);
        sVar9 = (short)((uint)iVar61 >> 0x10);
        cVar5 = (char)((uint)iVar61 >> 0x10);
        sVar57 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9),cVar3);
        sVar10 = (short)iVar77;
        cVar18 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar77 - (0xff < sVar10);
        sVar11 = (short)((uint)iVar77 >> 0x10);
        cVar6 = (char)((uint)iVar77 >> 0x10);
        uVar62 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11),
                          CONCAT12(cVar18,sVar57));
        sVar12 = (short)iVar78;
        cVar17 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar78 - (0xff < sVar12);
        sVar13 = (short)((uint)iVar78 >> 0x10);
        cVar19 = (char)((uint)iVar78 >> 0x10);
        uVar86 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar19 - (0xff < sVar13),
                          CONCAT14(cVar17,uVar62));
        sVar14 = (short)iVar79;
        cVar16 = (0 < sVar14) * (sVar14 < 0x100) * (char)iVar79 - (0xff < sVar14);
        sVar15 = (short)((uint)iVar79 >> 0x10);
        cVar20 = (char)((uint)iVar79 >> 0x10);
        uVar87 = CONCAT17((0 < sVar15) * (sVar15 < 0x100) * cVar20 - (0xff < sVar15),
                          CONCAT16(cVar16,uVar86));
        cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar61 - (0xff < sVar8);
        auVar88._0_10_ =
             CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9),CONCAT18(cVar4,uVar87))
        ;
        cVar7 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar77 - (0xff < sVar10);
        auVar88[10] = cVar7;
        auVar88[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
        cVar6 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar78 - (0xff < sVar12);
        auVar90[0xc] = cVar6;
        auVar90._0_12_ = auVar88;
        auVar90[0xd] = (0 < sVar13) * (sVar13 < 0x100) * cVar19 - (0xff < sVar13);
        cVar5 = (0 < sVar14) * (sVar14 < 0x100) * (char)iVar79 - (0xff < sVar14);
        auVar93[0xe] = cVar5;
        auVar93._0_14_ = auVar90;
        auVar93[0xf] = (0 < sVar15) * (sVar15 < 0x100) * cVar20 - (0xff < sVar15);
        sVar8 = (short)((uint)uVar62 >> 0x10);
        uVar85 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar18 - (0xff < sVar8),
                          (0 < sVar57) * (sVar57 < 0x100) * cVar3 - (0xff < sVar57));
        sVar9 = (short)((uint6)uVar86 >> 0x20);
        sVar10 = (short)((ulong)uVar87 >> 0x30);
        uVar62 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar16 - (0xff < sVar10),
                          CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar17 - (0xff < sVar9),uVar85));
        sVar11 = (short)((unkuint10)auVar88._0_10_ >> 0x40);
        sVar12 = auVar88._10_2_;
        uVar86 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12),
                          CONCAT14((0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11),uVar62)
                         );
        sVar13 = auVar90._12_2_;
        sVar14 = auVar93._14_2_;
        uVar87 = CONCAT17((0 < sVar14) * (sVar14 < 0x100) * cVar5 - (0xff < sVar14),
                          CONCAT16((0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13),uVar86)
                         );
        auVar89._0_10_ =
             CONCAT19((0 < sVar8) * (sVar8 < 0x100) * cVar18 - (0xff < sVar8),
                      CONCAT18((0 < sVar57) * (sVar57 < 0x100) * cVar3 - (0xff < sVar57),uVar87));
        auVar89[10] = (0 < sVar9) * (sVar9 < 0x100) * cVar17 - (0xff < sVar9);
        auVar89[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar16 - (0xff < sVar10);
        auVar91[0xc] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
        auVar91._0_12_ = auVar89;
        auVar91[0xd] = (0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12);
        auVar94[0xe] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
        auVar94._0_14_ = auVar91;
        auVar94[0xf] = (0 < sVar14) * (sVar14 < 0x100) * cVar5 - (0xff < sVar14);
        auVar54 = psllw(auVar94,4);
        *(uint *)(puVar51 + lVar53) = auVar54._0_4_ & 0xf0f0f0f0 | uVar63 & (uint)DAT_0014e5d0;
        auVar74._0_2_ = uVar58 >> 4;
        auVar74._2_2_ = (ushort)(uVar63 >> 0x14);
        auVar74._4_2_ = (ushort)((uint6)uVar64 >> 0x24);
        auVar74._6_2_ = (ushort)((ulong)uVar65 >> 0x34);
        auVar74._8_2_ = (ushort)((unkuint10)auVar67._0_10_ >> 0x44);
        auVar74._10_2_ = auVar67._10_2_ >> 4;
        auVar74._12_2_ = auVar69._12_2_ >> 4;
        auVar74._14_2_ = auVar73._14_2_ >> 4;
        auVar70 = auVar74._0_15_ & auVar49._0_15_;
        auVar92[0xd] = 0;
        auVar92._0_13_ = auVar70._0_13_;
        auVar92[0xe] = auVar70[7];
        auVar24[0xc] = auVar70[6];
        auVar24._0_12_ = auVar70._0_12_;
        auVar24._13_2_ = auVar92._13_2_;
        auVar26[0xb] = 0;
        auVar26._0_11_ = auVar70._0_11_;
        auVar26._12_3_ = auVar24._12_3_;
        auVar29[10] = auVar70[5];
        auVar29._0_10_ = auVar70._0_10_;
        auVar29._11_4_ = auVar26._11_4_;
        auVar31[9] = 0;
        auVar31._0_9_ = auVar70._0_9_;
        auVar31._10_5_ = auVar29._10_5_;
        auVar35._1_6_ = auVar31._9_6_;
        auVar35[0] = auVar70[4];
        auVar35._7_8_ = 0;
        Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),auVar70[3]);
        auVar43._9_6_ = 0;
        auVar43._0_9_ = Var36;
        auVar37._1_10_ = SUB1510(auVar43 << 0x30,5);
        auVar37[0] = auVar70[2];
        auVar44._11_4_ = 0;
        auVar44._0_11_ = auVar37;
        auVar38._1_12_ = SUB1512(auVar44 << 0x20,3);
        auVar38[0] = auVar70[1];
        uVar58 = CONCAT11(0,auVar70[0]);
        auVar34._2_13_ = auVar38;
        auVar34._0_2_ = uVar58;
        auVar22._10_2_ = 0;
        auVar22._0_10_ = auVar34._0_10_;
        auVar22._12_2_ = (short)Var36;
        uVar47 = CONCAT42(auVar22._10_4_,auVar37._0_2_);
        auVar39._6_8_ = 0;
        auVar39._0_6_ = uVar47;
        auVar55._4_4_ = (int)(float)(iVar82 * 0x800000 + 0x3f800000);
        auVar55._12_4_ = (int)(float)(iVar84 * 0x800000 + 0x3f800000);
        auVar55._0_4_ = auVar55._4_4_;
        auVar55._8_4_ = auVar55._12_4_;
        auVar95._0_2_ = uVar85 >> 4;
        auVar95._2_2_ = (ushort)((uint)uVar62 >> 0x14);
        auVar95._4_2_ = (ushort)((uint6)uVar86 >> 0x24);
        auVar95._6_2_ = (ushort)((ulong)uVar87 >> 0x34);
        auVar95._8_2_ = (ushort)((unkuint10)auVar89._0_10_ >> 0x44);
        auVar95._10_2_ = auVar89._10_2_ >> 4;
        auVar95._12_2_ = auVar91._12_2_ >> 4;
        auVar95._14_2_ = auVar94._14_2_ >> 4;
        auVar92 = auVar95._0_15_ & auVar49._0_15_;
        auVar70[0xd] = 0;
        auVar70._0_13_ = auVar92._0_13_;
        auVar70[0xe] = auVar92[7];
        auVar23[0xc] = auVar92[6];
        auVar23._0_12_ = auVar92._0_12_;
        auVar23._13_2_ = auVar70._13_2_;
        auVar25[0xb] = 0;
        auVar25._0_11_ = auVar92._0_11_;
        auVar25._12_3_ = auVar23._12_3_;
        auVar27[10] = auVar92[5];
        auVar27._0_10_ = auVar92._0_10_;
        auVar27._11_4_ = auVar25._11_4_;
        auVar30[9] = 0;
        auVar30._0_9_ = auVar92._0_9_;
        auVar30._10_5_ = auVar27._10_5_;
        auVar40._1_6_ = auVar30._9_6_;
        auVar40[0] = auVar92[4];
        auVar40._7_8_ = 0;
        Var36 = CONCAT81(SUB158(auVar40 << 0x40,7),auVar92[3]);
        auVar45._9_6_ = 0;
        auVar45._0_9_ = Var36;
        auVar41._1_10_ = SUB1510(auVar45 << 0x30,5);
        auVar41[0] = auVar92[2];
        auVar46._11_4_ = 0;
        auVar46._0_11_ = auVar41;
        auVar32[2] = auVar92[1];
        auVar32._0_2_ = auVar92._0_2_;
        auVar32._3_12_ = SUB1512(auVar46 << 0x20,3);
        auVar33._2_13_ = auVar32._2_13_;
        auVar33._0_2_ = auVar92._0_2_ & 0xff;
        auVar21._10_2_ = 0;
        auVar21._0_10_ = auVar33._0_10_;
        auVar21._12_2_ = (short)Var36;
        uVar48 = CONCAT42(auVar21._10_4_,auVar41._0_2_);
        auVar42._6_8_ = 0;
        auVar42._0_6_ = uVar48;
        auVar28._4_2_ = auVar32._2_2_;
        auVar28._0_4_ = auVar33._0_4_;
        auVar28._6_8_ = SUB148(auVar42 << 0x40,6);
        auVar56._4_4_ = (int)(float)((iVar101 + 0x10) * 0x800000 + 0x3f800000);
        auVar56._12_4_ = (int)(float)((iVar103 + 0x10) * 0x800000 + 0x3f800000);
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        uVar59 = uVar59 | (auVar33._0_4_ & 0xffff) *
                          (int)(float)((iVar100 + 0x10) * 0x800000 + 0x3f800000) +
                          (uint)uVar58 * (int)(float)(iVar80 * 0x800000 + 0x3f800000);
        uVar75 = uVar75 | auVar56._4_4_ * auVar28._4_4_ +
                          auVar55._4_4_ * (int)CONCAT82(SUB148(auVar39 << 0x40,6),auVar38._0_2_);
        uVar98 = uVar98 | (int)(((ulong)uVar48 & 0xffffffff) *
                               (ulong)(uint)(int)(float)((iVar102 + 0x10) * 0x800000 + 0x3f800000))
                          + (int)(((ulong)uVar47 & 0xffffffff) *
                                 (ulong)(uint)(int)(float)(iVar83 * 0x800000 + 0x3f800000));
        uVar99 = uVar99 | (int)((auVar56._8_8_ & 0xffffffff) * (ulong)(auVar21._10_4_ >> 0x10)) +
                          (int)((auVar55._8_8_ & 0xffffffff) * (ulong)(auVar22._10_4_ >> 0x10));
        lVar53 = lVar53 + 4;
        iVar80 = iVar80 + 4;
        iVar82 = iVar82 + 4;
        iVar83 = iVar83 + 4;
        iVar84 = iVar84 + 4;
        iVar100 = iVar100 + 4;
        iVar101 = iVar101 + 4;
        iVar102 = iVar102 + 4;
        iVar103 = iVar103 + 4;
      } while (lVar53 != 0x10);
      *(uint *)y[uVar52].qh = uVar99 | uVar75 | uVar98 | uVar59;
      uVar52 = uVar52 + 1;
      x = x + 0x20;
      puVar51 = puVar51 + 0x18;
    } while (uVar52 != (uVar50 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q5_1_ref(const float * GGML_RESTRICT x, block_q5_1 * GGML_RESTRICT y, int64_t k) {
    const int qk = QK5_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        float min = FLT_MAX;
        float max = -FLT_MAX;

        for (int j = 0; j < qk; j++) {
            const float v = x[i*qk + j];

            if (v < min) min = v;
            if (v > max) max = v;
        }

        const float d  = (max - min) / ((1 << 5) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);
        y[i].m = GGML_FP32_TO_FP16(min);

        uint32_t qh = 0;

        for (int j = 0; j < qk/2; ++j) {
            const float x0 = (x[i*qk + 0    + j] - min)*id;
            const float x1 = (x[i*qk + qk/2 + j] - min)*id;

            const uint8_t xi0 = (uint8_t)(x0 + 0.5f);
            const uint8_t xi1 = (uint8_t)(x1 + 0.5f);

            y[i].qs[j] = (xi0 & 0x0F) | ((xi1 & 0x0F) << 4);

            // get the 5-th bit and store it in qh at the right position
            qh |= ((xi0 & 0x10u) >> 4) << (j + 0);
            qh |= ((xi1 & 0x10u) >> 4) << (j + qk/2);
        }

        memcpy(&y[i].qh, &qh, sizeof(y[i].qh));
    }
}